

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

void __thiscall
irr::core::string<unsigned_short>::reallocate(string<unsigned_short> *this,s32 new_size)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  puVar1 = this->array;
  uVar3 = 0xffffffffffffffff;
  if (-1 < new_size) {
    uVar3 = (ulong)(uint)new_size * 2;
  }
  puVar2 = (unsigned_short *)operator_new__(uVar3);
  this->array = puVar2;
  this->allocated = new_size;
  if (this->used < new_size) {
    new_size = this->used;
  }
  uVar4 = (ulong)(uint)new_size;
  uVar3 = 0;
  if (new_size < 1) {
    uVar4 = 0;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    this->array[uVar3] = puVar1[uVar3];
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (puVar1 != (unsigned_short *)0x0) {
    operator_delete__(puVar1);
    return;
  }
  return;
}

Assistant:

void reallocate(s32 new_size)
	{
		T* old_array = array;

		array = new T[new_size];
		allocated = new_size;
		
		s32 amount = used < new_size ? used : new_size;
		for (s32 i=0; i<amount; ++i)
			array[i] = old_array[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_array;
	}